

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporterFactory.cpp
# Opt level: O0

shared_ptr<ApprovalTests::Reporter> ApprovalTests::DefaultReporterFactory::getDefaultReporter(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ApprovalTests::Reporter> *in_RDI;
  shared_ptr<ApprovalTests::Reporter> sVar1;
  shared_ptr<ApprovalTests::Reporter> *this;
  
  this = in_RDI;
  defaultReporter();
  ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr(this,in_RDI);
  sVar1.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::Reporter>)
         sVar1.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reporter> DefaultReporterFactory::getDefaultReporter()
    {
        return defaultReporter();
    }